

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool fun_00;
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  byte in_CL;
  Vector *in_RDX;
  long *result_data;
  long *rdata;
  long *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  long left_00;
  
  fun_00 = (bool)(in_CL & 1);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  plVar2 = ConstantVector::GetData<long>((Vector *)0xe816f4);
  plVar3 = ConstantVector::GetData<long>((Vector *)0xe81703);
  plVar4 = ConstantVector::GetData<long>((Vector *)0xe81712);
  bVar1 = ConstantVector::IsNull((Vector *)0xe81721);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xe8172f), !bVar1)) {
    lVar5 = *plVar2;
    left_00 = *plVar3;
    ConstantVector::Validity(in_RDX);
    lVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseShiftRightOperator,long,long,long>
                      (fun_00,left_00,lVar5,in_stack_ffffffffffffffa8,0xe81792);
    *plVar4 = lVar5;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}